

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O3

Bal_Man_t * Bal_ManAlloc(Gia_Man_t *pGia,Gia_Man_t *pNew,int nLutSize,int nCutNum,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Bal_Man_t *pBVar3;
  Vec_Int_t *pVVar4;
  int *__ptr;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  abctime aVar8;
  int iVar9;
  uint uVar10;
  timespec ts;
  timespec local_40;
  
  pBVar3 = (Bal_Man_t *)calloc(1,0x38);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    aVar8 = -1;
  }
  else {
    aVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pBVar3->clkStart = aVar8;
  pBVar3->pGia = pGia;
  pBVar3->pNew = pNew;
  pBVar3->nLutSize = nLutSize;
  pBVar3->nCutNum = nCutNum;
  pBVar3->fVerbose = fVerbose;
  iVar2 = (pGia->nObjs * 3) / 2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar9 = iVar2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar9 << 2);
  }
  pVVar4->pArray = __ptr;
  pBVar3->vCosts = pVVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  if (iVar2 - 1U < 7) {
    iVar2 = 8;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar2;
  if (iVar2 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar2 << 3);
  }
  pVVar5->pArray = ppvVar6;
  pBVar3->vCutSets = pVVar5;
  uVar1 = pNew->nObjs;
  if (iVar9 < (int)uVar1) {
    if (__ptr == (int *)0x0) {
      __ptr = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      __ptr = (int *)realloc(__ptr,(long)(int)uVar1 << 2);
    }
    pVVar4->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = uVar1;
  }
  uVar10 = uVar1;
  if (0 < (int)uVar1) {
    memset(__ptr,0,(ulong)uVar1 * 4);
    uVar10 = pNew->nObjs;
    iVar2 = pVVar5->nCap;
  }
  pVVar4->nSize = uVar1;
  if (iVar2 < (int)uVar10) {
    if (ppvVar6 == (void **)0x0) {
      ppvVar6 = (void **)malloc((long)(int)uVar10 << 3);
    }
    else {
      ppvVar6 = (void **)realloc(ppvVar6,(long)(int)uVar10 << 3);
    }
    pVVar5->pArray = ppvVar6;
    pVVar5->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    uVar7 = 0;
    do {
      pVVar5->pArray[uVar7] = (void *)0x0;
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  pVVar5->nSize = uVar10;
  pNew->pData = pBVar3;
  return pBVar3;
}

Assistant:

Bal_Man_t * Bal_ManAlloc( Gia_Man_t * pGia, Gia_Man_t * pNew, int nLutSize, int nCutNum, int fVerbose )
{
    Bal_Man_t * p;
    p = ABC_CALLOC( Bal_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pNew     = pNew;
    p->nLutSize = nLutSize;
    p->nCutNum  = nCutNum;
    p->fVerbose = fVerbose;
    p->vCosts   = Vec_IntAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    p->vCutSets = Vec_PtrAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    Vec_IntFill( p->vCosts, Gia_ManObjNum(pNew), 0 );
    Vec_PtrFill( p->vCutSets, Gia_ManObjNum(pNew), NULL );
    pNew->pData = p;
    return p;
}